

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void openStatTable(Parse *pParse,int iDb,int iStatCur,char *zWhere,char *zWhereType)

{
  int iTab;
  char *zName;
  Op *pOVar1;
  Vdbe *pVVar2;
  int iVar3;
  Table *pTVar4;
  char **ppcVar5;
  long lVar6;
  Db *pDVar7;
  u8 aCreateTbl [3];
  int aRoot [3];
  byte local_73 [3];
  int local_70;
  int local_6c;
  Vdbe *local_68;
  Db *local_60;
  sqlite3 *local_58;
  char *local_50;
  char *local_48;
  int local_3c [3];
  
  local_58 = pParse->db;
  local_68 = pParse->pVdbe;
  local_50 = zWhereType;
  local_48 = zWhere;
  if ((local_68 == (Vdbe *)0x0) && (local_68 = allocVdbe(pParse), local_68 == (Vdbe *)0x0)) {
    return;
  }
  pDVar7 = local_58->aDb + iDb;
  ppcVar5 = &openStatTable::aTable[0].zCols;
  lVar6 = 0;
  local_70 = iDb;
  local_6c = iStatCur;
  local_60 = pDVar7;
  do {
    zName = ((anon_struct_16_2_c5ef36f1 *)(ppcVar5 + -1))->zName;
    pTVar4 = sqlite3FindTable(local_58,zName,pDVar7->zDbSName);
    iVar3 = local_70;
    if (pTVar4 == (Table *)0x0) {
      if (*ppcVar5 != (char *)0x0) {
        sqlite3NestedParse(pParse,"CREATE TABLE %Q.%s(%s)",pDVar7->zDbSName,zName);
        local_3c[lVar6] = pParse->regRoot;
        local_73[lVar6] = 0x10;
      }
    }
    else {
      iTab = pTVar4->tnum;
      local_3c[lVar6] = iTab;
      local_73[lVar6] = 0;
      sqlite3TableLock(pParse,local_70,iTab,'\x01',zName);
      pDVar7 = local_60;
      if (local_48 == (char *)0x0) {
        sqlite3VdbeAddOp3(local_68,0x83,iTab,iVar3,0);
        pDVar7 = local_60;
      }
      else {
        sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE %s=%Q",local_60->zDbSName,zName,local_50)
        ;
      }
    }
    pVVar2 = local_68;
    lVar6 = lVar6 + 1;
    ppcVar5 = ppcVar5 + 2;
  } while (lVar6 != 3);
  iVar3 = sqlite3VdbeAddOp3(local_68,0x69,local_6c,local_3c[0],local_70);
  if (pVVar2->db->mallocFailed == '\0') {
    pOVar1 = pVVar2->aOp;
    pOVar1[iVar3].p4type = -3;
    pOVar1[iVar3].p4.i = 3;
  }
  if (0 < (long)pVVar2->nOp) {
    pVVar2->aOp[(long)pVVar2->nOp + -1].p5 = (ushort)local_73[0];
  }
  return;
}

Assistant:

static void openStatTable(
  Parse *pParse,          /* Parsing context */
  int iDb,                /* The database we are looking in */
  int iStatCur,           /* Open the sqlite_stat1 table on this cursor */
  const char *zWhere,     /* Delete entries for this table or index */
  const char *zWhereType  /* Either "tbl" or "idx" */
){
  static const struct {
    const char *zName;
    const char *zCols;
  } aTable[] = {
    { "sqlite_stat1", "tbl,idx,stat" },
#if defined(SQLITE_ENABLE_STAT4)
    { "sqlite_stat4", "tbl,idx,neq,nlt,ndlt,sample" },
    { "sqlite_stat3", 0 },
#elif defined(SQLITE_ENABLE_STAT3)
    { "sqlite_stat3", "tbl,idx,neq,nlt,ndlt,sample" },
    { "sqlite_stat4", 0 },
#else
    { "sqlite_stat3", 0 },
    { "sqlite_stat4", 0 },
#endif
  };
  int i;
  sqlite3 *db = pParse->db;
  Db *pDb;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int aRoot[ArraySize(aTable)];
  u8 aCreateTbl[ArraySize(aTable)];

  if( v==0 ) return;
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3VdbeDb(v)==db );
  pDb = &db->aDb[iDb];

  /* Create new statistic tables if they do not exist, or clear them
  ** if they do already exist.
  */
  for(i=0; i<ArraySize(aTable); i++){
    const char *zTab = aTable[i].zName;
    Table *pStat;
    if( (pStat = sqlite3FindTable(db, zTab, pDb->zDbSName))==0 ){
      if( aTable[i].zCols ){
        /* The sqlite_statN table does not exist. Create it. Note that a 
        ** side-effect of the CREATE TABLE statement is to leave the rootpage 
        ** of the new table in register pParse->regRoot. This is important 
        ** because the OpenWrite opcode below will be needing it. */
        sqlite3NestedParse(pParse,
            "CREATE TABLE %Q.%s(%s)", pDb->zDbSName, zTab, aTable[i].zCols
        );
        aRoot[i] = pParse->regRoot;
        aCreateTbl[i] = OPFLAG_P2ISREG;
      }
    }else{
      /* The table already exists. If zWhere is not NULL, delete all entries 
      ** associated with the table zWhere. If zWhere is NULL, delete the
      ** entire contents of the table. */
      aRoot[i] = pStat->tnum;
      aCreateTbl[i] = 0;
      sqlite3TableLock(pParse, iDb, aRoot[i], 1, zTab);
      if( zWhere ){
        sqlite3NestedParse(pParse,
           "DELETE FROM %Q.%s WHERE %s=%Q",
           pDb->zDbSName, zTab, zWhereType, zWhere
        );
      }else{
        /* The sqlite_stat[134] table already exists.  Delete all rows. */
        sqlite3VdbeAddOp2(v, OP_Clear, aRoot[i], iDb);
      }
    }
  }

  /* Open the sqlite_stat[134] tables for writing. */
  for(i=0; aTable[i].zCols; i++){
    assert( i<ArraySize(aTable) );
    sqlite3VdbeAddOp4Int(v, OP_OpenWrite, iStatCur+i, aRoot[i], iDb, 3);
    sqlite3VdbeChangeP5(v, aCreateTbl[i]);
    VdbeComment((v, aTable[i].zName));
  }
}